

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torcontrol.cpp
# Opt level: O2

void __thiscall TorController::Reconnect(TorController *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  _Bind<void_(TorController::*(TorController_*,_std::_Placeholder<1>))(TorControlConnection_&)>
  local_90;
  ConnectionCB local_78;
  _Bind<void_(TorController::*(TorController_*,_std::_Placeholder<1>))(TorControlConnection_&)>
  local_58;
  ConnectionCB local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_f = (offset_in_TorController_to_subr)connected_cb;
  local_58._8_8_ = 0;
  local_58._M_bound_args.super__Tuple_impl<0UL,_TorController_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_TorController_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_TorController_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_TorController_*,_std::_Placeholder<1>_>)this;
  std::function<void(TorControlConnection&)>::
  function<std::_Bind<void(TorController::*(TorController*,std::_Placeholder<1>))(TorControlConnection&)>,void>
            ((function<void(TorControlConnection&)> *)&local_40,&local_58);
  local_90._M_f = (offset_in_TorController_to_subr)disconnected_cb;
  local_90._8_8_ = 0;
  local_90._M_bound_args.super__Tuple_impl<0UL,_TorController_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_TorController_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_TorController_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_TorController_*,_std::_Placeholder<1>_>)this;
  std::function<void(TorControlConnection&)>::
  function<std::_Bind<void(TorController::*(TorController*,std::_Placeholder<1>))(TorControlConnection&)>,void>
            ((function<void(TorControlConnection&)> *)&local_78,&local_90);
  bVar1 = TorControlConnection::Connect(&this->conn,&this->m_tor_control_center,&local_40,&local_78)
  ;
  std::_Function_base::~_Function_base(&local_78.super__Function_base);
  std::_Function_base::~_Function_base(&local_40.super__Function_base);
  if (!bVar1) {
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/torcontrol.cpp"
    ;
    source_file._M_len = 0x5e;
    logging_function._M_str = "Reconnect";
    logging_function._M_len = 9;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function,source_file,0x28a,ALL,Info,(ConstevalFormatString<1U>)0x6c0c5a,
               &this->m_tor_control_center);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TorController::Reconnect()
{
    /* Try to reconnect and reestablish if we get booted - for example, Tor
     * may be restarting.
     */
    if (!conn.Connect(m_tor_control_center, std::bind(&TorController::connected_cb, this, std::placeholders::_1),
         std::bind(&TorController::disconnected_cb, this, std::placeholders::_1) )) {
        LogPrintf("tor: Re-initiating connection to Tor control port %s failed\n", m_tor_control_center);
    }
}